

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O2

void __thiscall TCV::visit(TCV *this,AddOp *node)

{
  bool bVar1;
  ASTNode *pAVar2;
  string sStack_98;
  string errorString;
  string rhsType;
  string lhsType;
  
  pAVar2 = AST::ASTNode::getChild(&node->super_ASTNode,0);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  std::__cxx11::string::string((string *)&lhsType,(string *)&this->returnType);
  pAVar2 = AST::ASTNode::getChild(&node->super_ASTNode,2);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  std::__cxx11::string::string((string *)&rhsType,(string *)&this->returnType);
  bVar1 = isMatchType(&lhsType,&rhsType);
  if (!bVar1) {
    std::__cxx11::to_string(&sStack_98,this->position);
    std::operator+(&errorString,"Unmatched type at line ",&sStack_98);
    std::__cxx11::string::~string((string *)&sStack_98);
    Semantic::Detector::addError(this->detector,&errorString);
    std::__cxx11::string::~string((string *)&errorString);
  }
  std::__cxx11::string::~string((string *)&rhsType);
  std::__cxx11::string::~string((string *)&lhsType);
  return;
}

Assistant:

void TCV::visit(AddOp *node) {
    node->getChild(0)->accept(*this);
    std::string lhsType = returnType;
    node->getChild(2)->accept(*this);
    std::string rhsType = returnType;
    if (!isMatchType(lhsType, rhsType)) {
        std::string errorString = "Unmatched type at line " + std::to_string(position);
        detector->addError(errorString);
    }
}